

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

void __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (cmLinkLineDeviceComputer *this,cmComputeLinkInformation *cli,string *stdLibString,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *linkLibraries)

{
  bool bVar1;
  reference l;
  Item *this_00;
  size_t this_01;
  bool bVar2;
  TargetType TVar3;
  ItemVector *this_02;
  cmGeneratorTarget *pcVar4;
  cmLinkImplementation *this_03;
  string *psVar5;
  ulong uVar6;
  string_view sVar7;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar8;
  cmAlphaNum local_328;
  cmAlphaNum local_2f8;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  string libPath;
  cmLinkImplItem *iter;
  const_iterator __end3;
  const_iterator __begin3;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *__range3;
  cmLinkImplementation *local_228;
  cmLinkImplementation *linkImpl;
  undefined1 local_218;
  _Base_ptr local_210;
  undefined1 local_208;
  int local_200;
  allocator<char> local_1f9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  string local_1d8;
  string local_1b8;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_198;
  string_view local_168;
  string_view local_158;
  cmListFileBacktrace local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [8];
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> linkLib;
  string local_e0;
  byte local_b9;
  reference pIStack_b8;
  bool skip;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  undefined1 local_90 [7];
  bool skipItemAfterFramework;
  string config;
  ItemVector *items;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *linkLibraries_local;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  emitted._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)linkLibraries;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&items);
  this_02 = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)local_90,cli);
  bVar1 = false;
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin(this_02);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_02);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                *)&item);
    if (!bVar2) {
      uVar6 = std::__cxx11::string::empty();
      this_01 = emitted._M_t._M_impl.super__Rb_tree_header._M_node_count;
      if ((uVar6 & 1) == 0) {
        cmAlphaNum::cmAlphaNum(&local_2f8,stdLibString);
        cmAlphaNum::cmAlphaNum(&local_328,' ');
        cmStrCat<>(&local_2c8,&local_2f8,&local_328);
        std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
        emplace_back<std::__cxx11::string>
                  ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                   this_01,&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
      }
      std::__cxx11::string::~string((string *)local_90);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&items);
      return;
    }
    pIStack_b8 = __gnu_cxx::
                 __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                 ::operator*(&__end1);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      if (pIStack_b8->Target != (cmGeneratorTarget *)0x0) {
        local_b9 = 0;
        TVar3 = cmGeneratorTarget::GetType(pIStack_b8->Target);
        if (TVar3 == STATIC_LIBRARY) {
          pcVar4 = pIStack_b8->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e0,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                     (allocator<char> *)
                     ((long)&linkLib.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
          local_b9 = cmGeneratorTarget::GetPropertyAsBool(pcVar4,&local_e0);
          std::__cxx11::string::~string((string *)&local_e0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&linkLib.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 7));
        }
        else if ((TVar3 - SHARED_LIBRARY < 2) || (TVar3 == INTERFACE_LIBRARY)) {
          local_b9 = 1;
        }
        if ((local_b9 & 1) != 0) goto LAB_008a5768;
      }
      std::__cxx11::string::string((string *)&local_138);
      local_148.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      local_148.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      cmListFileBacktrace::cmListFileBacktrace(&local_148);
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_118,&local_138,&local_148);
      cmListFileBacktrace::~cmListFileBacktrace(&local_148);
      std::__cxx11::string::~string((string *)&local_138);
      l = pIStack_b8;
      if (pIStack_b8->IsPath == Yes) {
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)pIStack_b8);
        local_158 = sVar7;
        bVar2 = cmHasLiteralSuffix<3ul>(sVar7,(char (*) [3])0xd4862f);
        if (!bVar2) {
          sVar7 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)pIStack_b8);
          local_168 = sVar7;
          bVar2 = cmHasLiteralSuffix<5ul>(sVar7,(char (*) [5])".lib");
          if (!bVar2) goto LAB_008a547f;
        }
        this_00 = pIStack_b8;
        (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])(&local_1d8);
        cmLinkLineComputer::ConvertToOutputFormat
                  (&local_1b8,&this->super_cmLinkLineComputer,&local_1d8);
        cmComputeLinkInformation::Item::GetFormattedItem(&local_198,this_00,&local_1b8);
        std::__cxx11::string::operator=((string *)local_118,(string *)&local_198);
        BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                  (&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_1d8);
LAB_008a547f:
        pVar8 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&items,(value_type *)local_118);
        linkImpl = (cmLinkImplementation *)pVar8.first._M_node;
        local_218 = pVar8.second;
        local_210 = (_Base_ptr)linkImpl;
        local_208 = local_218;
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          std::__cxx11::string::operator+=((string *)local_118," ");
          pcVar4 = cmComputeLinkInformation::GetTarget(cli);
          cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)&__range3,cli);
          this_03 = cmGeneratorTarget::GetLinkImplementation(pcVar4,(string *)&__range3,Link);
          std::__cxx11::string::~string((string *)&__range3);
          local_228 = this_03;
          __end3 = std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::begin
                             ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_03);
          iter = (cmLinkImplItem *)
                 std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::end
                           ((vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> *)this_03);
          while( true ) {
            bVar2 = __gnu_cxx::operator!=
                              (&__end3,(__normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                                        *)&iter);
            if (!bVar2) break;
            libPath.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
                 ::operator*(&__end3);
            if ((((reference)libPath.field_2._8_8_)->super_cmLinkItem).Target !=
                (cmGeneratorTarget *)0x0) {
              TVar3 = cmGeneratorTarget::GetType
                                ((((reference)libPath.field_2._8_8_)->super_cmLinkItem).Target);
              if (TVar3 != INTERFACE_LIBRARY) {
                pcVar4 = *(cmGeneratorTarget **)(libPath.field_2._8_8_ + 0x20);
                cmComputeLinkInformation::GetConfig_abi_cxx11_(&local_2a8,cli);
                psVar5 = cmGeneratorTarget::GetLocation(pcVar4,&local_2a8);
                std::__cxx11::string::string((string *)local_288,(string *)psVar5);
                std::__cxx11::string::~string((string *)&local_2a8);
                bVar2 = ::operator==(&pIStack_b8->Value,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_288);
                if (bVar2) {
                  cmListFileBacktrace::operator=
                            ((cmListFileBacktrace *)((long)&linkLib.Value.field_2 + 8),
                             (cmListFileBacktrace *)(libPath.field_2._8_8_ + 0x30));
                  local_200 = 5;
                }
                else {
                  local_200 = 0;
                }
                std::__cxx11::string::~string((string *)local_288);
                if (local_200 != 0) break;
              }
            }
            __gnu_cxx::
            __normal_iterator<const_cmLinkImplItem_*,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>
            ::operator++(&__end3);
          }
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<BT<std::__cxx11::string>&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)local_118);
        }
        local_200 = 0;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1f8,"-framework",&local_1f9);
        bVar2 = ::operator==(&l->Value,&local_1f8);
        std::__cxx11::string::~string((string *)&local_1f8);
        std::allocator<char>::~allocator(&local_1f9);
        if (!bVar2) {
          bVar2 = cmLinkItemValidForDevice((string *)pIStack_b8);
          if (bVar2) {
            std::__cxx11::string::operator=((string *)local_118,(string *)pIStack_b8);
          }
          goto LAB_008a547f;
        }
        bVar1 = true;
        local_200 = 3;
      }
      BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
                ((BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_118);
    }
LAB_008a5768:
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString,
  std::vector<BT<std::string>>& linkLibraries)
{
  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  using ItemVector = cmComputeLinkInformation::ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  // Note:
  // Any modification of this algorithm should be reflected also in
  // cmVisualStudio10TargetGenerator::ComputeCudaLinkOptions
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    BT<std::string> linkLib;
    if (item.IsPath == cmComputeLinkInformation::ItemIsPath::Yes) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value.Value, ".a") ||
          cmHasLiteralSuffix(item.Value.Value, ".lib")) {
        linkLib.Value = item
                          .GetFormattedItem(this->ConvertToOutputFormat(
                            this->ConvertToLinkReference(item.Value.Value)))
                          .Value;
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value.Value)) {
      linkLib.Value = item.Value.Value;
    }

    if (emitted.insert(linkLib.Value).second) {
      linkLib.Value += " ";

      const cmLinkImplementation* linkImpl =
        cli.GetTarget()->GetLinkImplementation(
          cli.GetConfig(), cmGeneratorTarget::LinkInterfaceFor::Link);

      for (const cmLinkImplItem& iter : linkImpl->Libraries) {
        if (iter.Target != nullptr &&
            iter.Target->GetType() != cmStateEnums::INTERFACE_LIBRARY) {
          std::string libPath = iter.Target->GetLocation(cli.GetConfig());
          if (item.Value == libPath) {
            linkLib.Backtrace = iter.Backtrace;
            break;
          }
        }
      }

      linkLibraries.emplace_back(linkLib);
    }
  }

  if (!stdLibString.empty()) {
    linkLibraries.emplace_back(cmStrCat(stdLibString, ' '));
  }
}